

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

bool __thiscall xray_re::xr_ogf_v4::load_omf(xr_ogf_v4 *this,char *path)

{
  bool bVar1;
  xr_error anon_var_0;
  xr_reader *pxStack_30;
  bool status;
  xr_reader *r;
  xr_file_system *fs;
  char *path_local;
  xr_ogf_v4 *this_local;
  
  fs = (xr_file_system *)path;
  path_local = (char *)this;
  r = (xr_reader *)xr_file_system::instance();
  pxStack_30 = xr_file_system::r_open((xr_file_system *)r,(char *)fs);
  bVar1 = pxStack_30 != (xr_reader *)0x0;
  if (bVar1) {
    load_omf(this,pxStack_30);
    xr_file_system::r_close((xr_file_system *)r,&stack0xffffffffffffffd0);
  }
  return bVar1;
}

Assistant:

bool xr_ogf_v4::load_omf(const char* path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0)
		return false;

	bool status = true;
	try {
		load_omf(*r);
	} catch (xr_error) {
		clear();
		status = false;
	}
	fs.r_close(r);
	return status;
}